

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  SPIRType *pSVar7;
  SPIRExpression *pSVar8;
  SPIRExpression *pSVar9;
  SPIRType *pSVar10;
  SPIRVariable *pSVar11;
  SPIRType *type;
  string *psVar12;
  ulong uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char cVar16;
  char *in_R8;
  char (*in_R9) [2];
  char (*pacVar17) [3];
  char (*pacVar18) [2];
  uint local_3b8;
  uint local_3b4;
  SPIRExpression *local_3b0;
  undefined4 local_3a8;
  uint32_t local_3a4;
  string rhs_row;
  string unpacked_expr;
  char *packed_pfx;
  string cast_expr;
  string cast_addr_space;
  string local_310;
  SPIRType vector_type;
  SPIRType write_type;
  
  pSVar7 = Compiler::expression_type((Compiler *)this,rhs_expression);
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypePacked);
  pSVar8 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,lhs_expression);
  pSVar9 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,rhs_expression);
  if (pSVar8 == (SPIRExpression *)0x0) {
    bVar4 = 0;
  }
  else {
    bVar4 = pSVar8->need_transpose;
  }
  local_3b0 = pSVar8;
  bVar3 = Compiler::has_decoration((Compiler *)this,(ID)lhs_expression,DecorationBuiltIn);
  if (((bVar3) &&
      (uVar5 = Compiler::get_decoration((Compiler *)this,(ID)lhs_expression,DecorationBuiltIn),
      uVar5 == 0x14)) && (bVar3 = Compiler::is_array((Compiler *)this,pSVar7), bVar3)) {
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
    CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
              ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&write_type,
               (char (*) [4])0x297dc7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vector_type,
               (char (*) [5])0x281407);
    ::std::__cxx11::string::~string((string *)&vector_type);
    ::std::__cxx11::string::~string((string *)&write_type);
  }
  else {
    if (bVar1 || bVar2) {
      if (bVar1) {
        uVar5 = Compiler::get_extended_decoration
                          ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
      }
      else {
        bVar1 = Compiler::is_matrix((Compiler *)this,pSVar7);
        if (!bVar1 && (bVar4 & 1) == 0) goto LAB_001dc82d;
        uVar5 = (pSVar7->super_IVariant).self.id;
      }
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
      ::std::__cxx11::string::string((string *)&cast_addr_space,"thread",(allocator *)&write_type);
      pSVar11 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_expression);
      if (pSVar11 != (SPIRVariable *)0x0) {
        type = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar11->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_((string *)&write_type,this,type,lhs_expression,false);
        ::std::__cxx11::string::operator=((string *)&cast_addr_space,(string *)&write_type);
        ::std::__cxx11::string::~string((string *)&write_type);
      }
      bVar1 = Compiler::is_matrix((Compiler *)this,pSVar7);
      if (bVar1) {
        packed_pfx = "";
        if (bVar2) {
          packed_pfx = "packed_";
        }
        if (pSVar9 == (SPIRExpression *)0x0) {
          local_3a8 = 0;
        }
        else {
          local_3a8 = (undefined4)CONCAT71((int7)((ulong)pSVar9 >> 8),pSVar9->need_transpose);
        }
        SPIRType::SPIRType(&write_type,pSVar7);
        cast_expr._M_dataplus._M_p = (pointer)&cast_expr.field_2;
        cast_expr._M_string_length = 0;
        cast_expr.field_2._M_local_buf[0] = '\0';
        if ((char)local_3a8 != '\0') {
          pSVar9->need_transpose = false;
        }
        if (bVar4 == 0) {
          write_type.columns = 1;
          if (pSVar10->vecsize != pSVar7->vecsize) {
            pacVar17 = (char (*) [3])0x1dccfa;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,&write_type,0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      ((string *)&vector_type,(spirv_cross *)0x29618e,(char (*) [2])&cast_addr_space
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x27f106,(char (*) [2])&packed_pfx,(char **)&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27de5a
                       ,pacVar17);
            ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
            ::std::__cxx11::string::~string((string *)&vector_type);
            ::std::__cxx11::string::~string((string *)&rhs_row);
          }
          if ((char)local_3a8 == '\0') {
            local_3a4 = rhs_expression;
            for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
                (uint)unpacked_expr._M_dataplus._M_p < pSVar7->columns;
                unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
              CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                        (&rhs_row,&this->super_CompilerGLSL,local_3a4,true);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,&cast_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x2828da,(uint *)&unpacked_expr,
                         (char (*) [2])0x2827df,(char (*) [4])0x297dc7,&rhs_row,
                         (char (*) [2])0x2828da,(uint *)&unpacked_expr,(char (*) [3])0x281409);
              ::std::__cxx11::string::~string((string *)&rhs_row);
              ::std::__cxx11::string::~string((string *)&vector_type);
            }
          }
          else {
            pSVar10 = Compiler::expression_type((Compiler *)this,rhs_expression);
            SPIRType::SPIRType(&vector_type,pSVar10);
            vector_type.columns = 1;
            for (local_3b4 = 0; local_3b4 < pSVar7->columns; local_3b4 = local_3b4 + 1) {
              CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                        (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
              ::std::operator+(&rhs_row,&unpacked_expr,"(");
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
              for (local_3b8 = 0; local_3b8 < vector_type.vecsize; local_3b8 = local_3b8 + 1) {
                pacVar18 = (char (*) [2])0x1dce1d;
                CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                          (&unpacked_expr,&this->super_CompilerGLSL,rhs_expression);
                join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&local_310,(spirv_cross *)&unpacked_expr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2828da,(char (*) [2])&local_3b8,(uint *)"][",(char (*) [3])&local_3b4,
                           (uint *)0x2827df,pacVar18);
                ::std::__cxx11::string::append((string *)&rhs_row);
                ::std::__cxx11::string::~string((string *)&local_310);
                if (local_3b8 + 1 < vector_type.vecsize) {
                  ::std::__cxx11::string::append((char *)&rhs_row);
                }
                ::std::__cxx11::string::~string((string *)&unpacked_expr);
              }
              ::std::__cxx11::string::append((char *)&rhs_row);
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x2828da,
                         &local_3b4,(char (*) [2])0x2827df,(char (*) [4])0x297dc7,&rhs_row,
                         (char (*) [2])0x297c5b);
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
              ::std::__cxx11::string::~string((string *)&rhs_row);
            }
            SPIRType::~SPIRType(&vector_type);
          }
        }
        else {
          local_3b0->need_transpose = false;
          write_type.columns = 1;
          write_type.vecsize = pSVar7->columns;
          if (pSVar10->columns != pSVar7->columns) {
            pacVar17 = (char (*) [3])0x1dcba1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,&write_type,0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      ((string *)&vector_type,(spirv_cross *)0x29618e,(char (*) [2])&cast_addr_space
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x27f106,(char (*) [2])&packed_pfx,(char **)&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27de5a
                       ,pacVar17);
            ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
            ::std::__cxx11::string::~string((string *)&vector_type);
            ::std::__cxx11::string::~string((string *)&rhs_row);
          }
          if ((char)local_3a8 == '\0') {
            pSVar10 = Compiler::expression_type((Compiler *)this,rhs_expression);
            SPIRType::SPIRType(&vector_type,pSVar10);
            vector_type.vecsize = vector_type.columns;
            vector_type.columns = 1;
            for (local_3b4 = 0; local_3b4 < pSVar7->vecsize; local_3b4 = local_3b4 + 1) {
              CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                        (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
              ::std::operator+(&rhs_row,&unpacked_expr,"(");
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
              uVar6 = 0;
              while (local_3b8 = uVar6, uVar6 < vector_type.vecsize) {
                pacVar18 = (char (*) [2])0x1dcfc3;
                CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                          (&local_310,&this->super_CompilerGLSL,rhs_expression,true);
                join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                          (&unpacked_expr,(spirv_cross *)&local_310,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2828da,(char (*) [2])&local_3b8,(uint *)"][",(char (*) [3])&local_3b4,
                           (uint *)0x2827df,pacVar18);
                ::std::__cxx11::string::append((string *)&rhs_row);
                ::std::__cxx11::string::~string((string *)&unpacked_expr);
                ::std::__cxx11::string::~string((string *)&local_310);
                uVar6 = local_3b8 + 1;
                if (uVar6 < vector_type.vecsize) {
                  ::std::__cxx11::string::append((char *)&rhs_row);
                  uVar6 = local_3b8 + 1;
                }
              }
              ::std::__cxx11::string::append((char *)&rhs_row);
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x2828da,
                         &local_3b4,(char (*) [2])0x2827df,(char (*) [4])0x297dc7,&rhs_row,
                         (char (*) [2])0x297c5b);
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
              ::std::__cxx11::string::~string((string *)&rhs_row);
            }
            SPIRType::~SPIRType(&vector_type);
          }
          else {
            for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
                (uint)unpacked_expr._M_dataplus._M_p < pSVar7->vecsize;
                unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
              CompilerGLSL::to_enclosed_expression_abi_cxx11_
                        ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
              CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                        (&rhs_row,&this->super_CompilerGLSL,rhs_expression);
              CompilerGLSL::
              statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                        (&this->super_CompilerGLSL,&cast_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x2828da,(uint *)&unpacked_expr,
                         (char (*) [2])0x2827df,(char (*) [4])0x297dc7,&rhs_row,
                         (char (*) [2])0x2828da,(uint *)&unpacked_expr,(char (*) [3])0x281409);
              ::std::__cxx11::string::~string((string *)&rhs_row);
              ::std::__cxx11::string::~string((string *)&vector_type);
            }
          }
          local_3b0->need_transpose = true;
        }
        if ((char)local_3a8 != '\0') {
          pSVar9->need_transpose = true;
        }
        ::std::__cxx11::string::~string((string *)&cast_expr);
      }
      else {
        if (bVar4 == 0) {
          bVar1 = Compiler::is_matrix((Compiler *)this,pSVar10);
          if (((bVar1) || (bVar1 = Compiler::is_array((Compiler *)this,pSVar10), bVar1)) &&
             ((pSVar10->vecsize < 5 && (pSVar7->vecsize < pSVar10->vecsize)))) {
            if (pSVar7->vecsize == 0) {
              __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x158c,
                            "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                           );
            }
            if (bVar2) {
              __assert_fail("!lhs_packed_type",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x1592,
                            "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                           );
            }
            CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                      ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_pointer_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,pSVar7,0);
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dc8ff;
            CompilerGLSL::enclose_expression
                      (&unpacked_expr,&this->super_CompilerGLSL,(string *)&write_type);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      (&cast_expr,(spirv_cross *)0x29618e,(char (*) [2])&cast_addr_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106
                       ,(char (*) [2])&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27de5a
                       ,(char (*) [3])&unpacked_expr,pbVar15);
            ::std::__cxx11::string::operator=((string *)&write_type,(string *)&cast_expr);
            ::std::__cxx11::string::~string((string *)&cast_expr);
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            ::std::__cxx11::string::~string((string *)&rhs_row);
            pSVar7 = Compiler::expression_type((Compiler *)this,rhs_expression);
            bVar1 = CompilerGLSL::optimize_read_modify_write
                              (&this->super_CompilerGLSL,pSVar7,(string *)&write_type,
                               (string *)&vector_type);
            if (!bVar1) {
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &write_type,(char (*) [4])0x297dc7,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x297c5b);
            }
          }
          else {
            bVar1 = Compiler::is_matrix((Compiler *)this,pSVar7);
            if (bVar1) goto LAB_001dd1b9;
            CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                      ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_pointer_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
            pSVar7 = Compiler::expression_type((Compiler *)this,rhs_expression);
            bVar1 = CompilerGLSL::optimize_read_modify_write
                              (&this->super_CompilerGLSL,pSVar7,(string *)&write_type,
                               (string *)&vector_type);
            if (!bVar1) {
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &write_type,(char (*) [4])0x297dc7,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x297c5b);
            }
          }
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
          goto LAB_001dd1b9;
        }
        local_3b0->need_transpose = false;
        local_3a4 = rhs_expression;
        SPIRType::SPIRType(&write_type,pSVar7);
        write_type.vecsize = 1;
        write_type.columns = 1;
        for (local_310._M_dataplus._M_p._0_4_ = 0;
            (uint)local_310._M_dataplus._M_p < pSVar7->vecsize;
            local_310._M_dataplus._M_p._0_4_ = (uint)local_310._M_dataplus._M_p + 1) {
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
          cVar16 = (char)&vector_type;
          psVar12 = (string *)::std::__cxx11::string::rfind(cVar16,0x5b);
          uVar13 = ::std::__cxx11::string::rfind(cVar16,0x5d);
          uVar14 = ::std::__cxx11::string::rfind(cVar16,0x2e);
          if ((uVar14 != 0xffffffffffffffff) && (uVar13 < uVar14)) {
            ::std::__cxx11::string::resize((ulong)&vector_type);
          }
          if (psVar12 != (string *)0xffffffffffffffff) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&cast_expr,this,&write_type,0);
            packed_pfx = (char *)CONCAT71(packed_pfx._1_7_,0x5b);
            local_3b4 = CONCAT31(local_3b4._1_3_,0x5d);
            join<char,unsigned_int&,char,char_const(&)[2]>
                      (&rhs_row,(spirv_cross *)&packed_pfx,(char *)&local_310,&local_3b4,")",in_R9);
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ::std::__cxx11::string::insert((ulong)&vector_type,psVar12);
            CompilerGLSL::to_extract_component_expression_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,local_3a4,
                       (uint)local_310._M_dataplus._M_p);
            in_R9 = (char (*) [2])0x297c4f;
            CompilerGLSL::
            statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [3])0x289859,&cast_addr_space,
                       (char (*) [2])0x27f106,&cast_expr,(char (*) [4])0x297c4f,pbVar15,
                       (char (*) [4])0x297dc7,&unpacked_expr,(char (*) [2])0x297c5b);
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            ::std::__cxx11::string::~string((string *)&rhs_row);
            ::std::__cxx11::string::~string((string *)&cast_expr);
          }
          ::std::__cxx11::string::~string((string *)&vector_type);
        }
        local_3b0->need_transpose = true;
      }
      SPIRType::~SPIRType(&write_type);
LAB_001dd1b9:
      Compiler::register_write((Compiler *)this,lhs_expression);
      ::std::__cxx11::string::~string((string *)&cast_addr_space);
      return;
    }
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar7);
    if ((local_3b0 == (SPIRExpression *)0x0) || (!bVar1)) {
      if (local_3b0 == (SPIRExpression *)0x0) goto LAB_001dc82d;
      bVar4 = local_3b0->need_transpose;
    }
    else {
      bVar4 = local_3b0->need_transpose;
      if ((bool)bVar4 == true) {
        local_3b0->need_transpose = false;
        if ((pSVar9 == (SPIRExpression *)0x0) || (pSVar9->need_transpose != true)) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [14])" = transpose(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [3])0x27d6e8);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
        }
        else {
          pSVar9->need_transpose = false;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x297dc7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x297c5b);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
          pSVar9->need_transpose = true;
        }
        local_3b0->need_transpose = true;
        goto LAB_001dca4b;
      }
    }
    if ((bVar4 & 1) == 0) {
LAB_001dc82d:
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,lhs_expression,rhs_expression);
      return;
    }
    local_3b0->need_transpose = false;
    uVar6 = 0;
    while( true ) {
      cast_expr._M_dataplus._M_p._0_4_ = uVar6;
      if (pSVar7->vecsize <= uVar6) break;
      CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
      psVar12 = (string *)::std::__cxx11::string::rfind((char)&write_type,0x5b);
      if (psVar12 != (string *)0xffffffffffffffff) {
        rhs_row._M_dataplus._M_p._0_1_ = 0x5b;
        unpacked_expr._M_dataplus._M_p._0_1_ = 0x5d;
        join<char,unsigned_int&,char>
                  ((string *)&vector_type,(spirv_cross *)&rhs_row,(char *)&cast_expr,
                   (uint *)&unpacked_expr,in_R8);
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::__cxx11::string::insert((ulong)&write_type,psVar12);
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&cast_addr_space,&this->super_CompilerGLSL,rhs_expression,
                   (uint)cast_expr._M_dataplus._M_p);
        in_R8 = ";";
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,pbVar15,(char (*) [4])0x297dc7,&cast_addr_space,
                   (char (*) [2])0x297c5b);
        ::std::__cxx11::string::~string((string *)&cast_addr_space);
        ::std::__cxx11::string::~string((string *)&vector_type);
      }
      ::std::__cxx11::string::~string((string *)&write_type);
      uVar6 = (uint)cast_expr._M_dataplus._M_p + 1;
    }
    local_3b0->need_transpose = true;
  }
LAB_001dca4b:
  Compiler::register_write((Compiler *)this,lhs_expression);
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	if (has_decoration(lhs_expression, DecorationBuiltIn) &&
	    BuiltIn(get_decoration(lhs_expression, DecorationBuiltIn)) == BuiltInSampleMask &&
	    is_array(type))
	{
		// Storing an array to SampleMask, have to remove the array-ness before storing.
		statement(to_expression(lhs_expression), " = ", to_enclosed_unpacked_expression(rhs_expression), "[0];");
		register_write(lhs_expression);
	}
	else if (!lhs_remapped_type && !lhs_packed_type)
	{
		// No physical type remapping, and no packed type, so can just emit a store directly.

		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');

				// Get rid of any ".data" half8 handling here, we're casting to scalar anyway.
				auto end_column_index = lhs_expr.find_last_of(']');
				auto end_dot_index = lhs_expr.find_last_of('.');
				if (end_dot_index != string::npos && end_dot_index > end_column_index)
					lhs_expr.resize(end_dot_index);

				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) &&
		         physical_type.vecsize <= 4 &&
		         physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}